

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

void __thiscall SQVM::Pop(SQVM *this,SQInteger n)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = 0;
  if (0 < n) {
    lVar2 = n;
  }
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    uVar1 = this->_top - 1;
    this->_top = uVar1;
    SQObjectPtr::Null((this->_stack)._vals + (uVar1 & 0xffffffff));
  }
  return;
}

Assistant:

void SQVM::Pop(SQInteger n) {
    ValidateThreadAccess();

    for(SQInteger i = 0; i < n; i++){
        _stack[--_top].Null();
    }
}